

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O1

void __thiscall I2sAnalyzer::AnalyzeFrame(I2sAnalyzer *this)

{
  uint num_bits;
  I2sAnalyzerSettings *pIVar1;
  ulong uVar2;
  U32 subframe_index;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  FrameV2 frame_v2;
  Frame frame;
  FrameV2 local_60 [8];
  unsigned_long_long local_58;
  unsigned_long_long local_50;
  undefined2 local_38;
  
  uVar6 = (ulong)((long)(this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataBits).super__Vector_base<BitState,_std::allocator<BitState>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2;
  uVar2 = (ulong)((this->mSettings)._M_ptr)->mFrameType;
  if (uVar2 < 3) {
    uVar3 = *(uint *)(&DAT_0010a074 + uVar2 * 4);
  }
  else {
    AnalyzerHelpers::Assert("unexpected");
    uVar3 = 0;
  }
  if ((uVar3 - 1 & (uint)uVar6) == 0) {
    subframe_index = 0;
    pIVar1 = (this->mSettings)._M_ptr;
    num_bits = pIVar1->mBitsPerWord;
    uVar5 = (uint)((uVar6 & 0xffffffff) / (ulong)uVar3);
    iVar4 = uVar5 - num_bits;
    if (num_bits <= uVar5) {
      if (pIVar1->mWordAlignment == LEFT_ALIGNED) {
        iVar4 = 0;
      }
      do {
        AnalyzeSubFrame(this,subframe_index * uVar5 + iVar4,num_bits,subframe_index);
        subframe_index = subframe_index + 1;
      } while (uVar3 + (uVar3 == 0) != subframe_index);
      return;
    }
    Frame::Frame((Frame *)&local_58);
    local_38 = 0x8002;
    local_58 = *(this->mDataValidEdges).
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_50 = (this->mDataValidEdges).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    FrameV2::FrameV2(local_60);
    FrameV2::AddString((char *)local_60,"error");
    AnalyzerResults::AddFrameV2
              ((FrameV2 *)(this->mResults)._M_ptr,(char *)local_60,0x10a00b,local_58);
  }
  else {
    Frame::Frame((Frame *)&local_58);
    local_38 = 0x8003;
    local_58 = *(this->mDataValidEdges).
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_start;
    local_50 = (this->mDataValidEdges).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish[-1];
    AnalyzerResults::AddFrame((Frame *)(this->mResults)._M_ptr);
    FrameV2::FrameV2(local_60);
    FrameV2::AddString((char *)local_60,"error");
    AnalyzerResults::AddFrameV2
              ((FrameV2 *)(this->mResults)._M_ptr,(char *)local_60,0x10a00b,local_58);
  }
  FrameV2::~FrameV2(local_60);
  Frame::~Frame((Frame *)&local_58);
  return;
}

Assistant:

void I2sAnalyzer::AnalyzeFrame()
{
    U32 num_bits = mDataBits.size();

    U32 num_frames = 0;
    switch( mSettings->mFrameType )
    {
    case FRAME_TRANSITION_TWICE_EVERY_WORD:
        num_frames = 1;
        break;
    case FRAME_TRANSITION_ONCE_EVERY_WORD:
        num_frames = 2;
        break;
    case FRAME_TRANSITION_TWICE_EVERY_FOUR_WORDS:
        num_frames = 4;
        break;
    default:
        AnalyzerHelpers::Assert( "unexpected" );
        break;
    }

    if( ( num_bits % num_frames ) != 0 )
    {
        Frame frame;
        frame.mType = U8( ErrorDoesntDivideEvenly );
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
        frame.mStartingSampleInclusive = mDataValidEdges.front();
        frame.mEndingSampleInclusive = mDataValidEdges.back();
        mResults->AddFrame( frame );
        FrameV2 frame_v2;
        frame_v2.AddString( "error", "invalid number of bits" );
        mResults->AddFrameV2( frame_v2, "error", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
        return;
    }

    U32 bits_per_frame = num_bits / num_frames;
    U32 num_audio_bits = mSettings->mBitsPerWord;

    if( bits_per_frame < num_audio_bits )
    {
        // enum I2sResultType { Channel1, Cahannel2, ErrorTooFewBits, ErrorDoesntDivideEvenly };
        Frame frame;
        frame.mType = U8( ErrorTooFewBits );
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
        frame.mStartingSampleInclusive = mDataValidEdges.front();
        frame.mEndingSampleInclusive = mDataValidEdges.back();
        mResults->AddFrame( frame );
        FrameV2 frame_v2;
        frame_v2.AddString( "error", "not enough bits" );
        mResults->AddFrameV2( frame_v2, "error", frame.mStartingSampleInclusive, frame.mEndingSampleInclusive );
        return;
    }

    U32 num_unused_bits = bits_per_frame - num_audio_bits;
    U32 starting_offset;

    if( mSettings->mWordAlignment == LEFT_ALIGNED )
        starting_offset = 0;
    else
        starting_offset = num_unused_bits;

    for( U32 i = 0; i < num_frames; i++ )
    {
        AnalyzeSubFrame( i * bits_per_frame + starting_offset, num_audio_bits, i );
    }
}